

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O0

void __thiscall f8n::db::Connection::UpdateReferenceCount(Connection *this,bool init)

{
  undefined1 local_28 [8];
  unique_lock<std::mutex> lock;
  bool init_local;
  Connection *this_local;
  
  lock._15_1_ = init;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&this->mutex);
  if ((lock._15_1_ & 1) == 0) {
    UpdateReferenceCount::count = UpdateReferenceCount::count + -1;
    if (UpdateReferenceCount::count < 1) {
      sqlite3_shutdown();
      UpdateReferenceCount::count = 0;
    }
  }
  else {
    if (UpdateReferenceCount::count == 0) {
      sqlite3_initialize();
    }
    UpdateReferenceCount::count = UpdateReferenceCount::count + 1;
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return;
}

Assistant:

void Connection::UpdateReferenceCount(bool init) {
    std::unique_lock<std::mutex> lock(this->mutex);

    static int count = 0;

    if (init) {
        if (count == 0) {
            sqlite3_initialize();
        }

        ++count;
    }
    else {
        --count;
        if (count <= 0) {
            sqlite3_shutdown();
            count = 0;
        }
    }
}